

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool __thiscall
PartiallySignedTransaction::GetInputUTXO
          (PartiallySignedTransaction *this,CTxOut *utxo,int input_index)

{
  pointer pPVar1;
  long lVar2;
  pointer pPVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  transaction_identifier<false> *other;
  CTxOut *pCVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (long)input_index;
  pPVar3 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = pPVar3 + lVar6;
  lVar4 = (long)pPVar3[lVar6].non_witness_utxo.
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (lVar4 == 0) {
    if ((pPVar1->witness_utxo).nValue != -1) {
      pCVar7 = &pPVar1->witness_utxo;
LAB_002e4dd7:
      CTxOut::operator=(utxo,pCVar7);
      bVar5 = true;
      goto LAB_002e4de8;
    }
  }
  else {
    other = (transaction_identifier<false> *)
            (lVar6 * 0x68 +
            *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin);
    uVar8 = (ulong)*(uint *)other[1].m_wrapped.super_base_blob<256U>.m_data._M_elems;
    if (uVar8 < (ulong)((*(long *)(lVar4 + 0x20) - *(long *)(lVar4 + 0x18)) / 0x28)) {
      bVar5 = transaction_identifier<false>::operator!=
                        ((transaction_identifier<false> *)(lVar4 + 0x39),other);
      if (!bVar5) {
        pCVar7 = (CTxOut *)
                 (uVar8 * 0x28 +
                 *(long *)((long)(pPVar1->non_witness_utxo).
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18));
        goto LAB_002e4dd7;
      }
    }
  }
  bVar5 = false;
LAB_002e4de8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::GetInputUTXO(CTxOut& utxo, int input_index) const
{
    const PSBTInput& input = inputs[input_index];
    uint32_t prevout_index = tx->vin[input_index].prevout.n;
    if (input.non_witness_utxo) {
        if (prevout_index >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != tx->vin[input_index].prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout_index];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
    } else {
        return false;
    }
    return true;
}